

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Frame::IsValid(Frame *this)

{
  bool bVar1;
  Frame *this_local;
  
  if ((this->length_ == 0) || (this->frame_ == (uint8_t *)0x0)) {
    this_local._7_1_ = false;
  }
  else if (((this->additional_length_ == 0) || (this->additional_ != (uint8_t *)0x0)) &&
          ((this->additional_ == (uint8_t *)0x0 || (this->additional_length_ != 0)))) {
    if ((this->track_number_ == 0) || (0x7e < this->track_number_)) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = CanBeSimpleBlock(this);
      if (((bVar1) || ((this->is_key_ & 1U) != 0)) ||
         ((this->reference_block_timestamp_set_ & 1U) != 0)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Frame::IsValid() const {
  if (length_ == 0 || !frame_) {
    return false;
  }
  if ((additional_length_ != 0 && !additional_) ||
      (additional_ != NULL && additional_length_ == 0)) {
    return false;
  }
  if (track_number_ == 0 || track_number_ > kMaxTrackNumber) {
    return false;
  }
  if (!CanBeSimpleBlock() && !is_key_ && !reference_block_timestamp_set_) {
    return false;
  }
  return true;
}